

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AgentOnlinePlanningMDP.cpp
# Opt level: O0

Index __thiscall
AgentOnlinePlanningMDP::Act(AgentOnlinePlanningMDP *this,Index sI,Index joI,double reward)

{
  long lVar1;
  pointer puVar2;
  int iVar3;
  uint uVar4;
  reference pvVar5;
  undefined8 uVar6;
  undefined4 in_EDX;
  undefined4 in_ESI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> aIs;
  Index jaInew;
  undefined8 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  Index IVar7;
  undefined4 in_stack_ffffffffffffffac;
  pointer in_stack_ffffffffffffffc8;
  E *in_stack_ffffffffffffffd0;
  
  if ((in_RDI->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish != (pointer)0x0) {
    lVar1 = *(long *)((in_RDI->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                      _M_impl.super__Vector_impl_data._M_start + -6);
    iVar3 = (**(code **)(*(long *)((long)&(in_RDI->
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          )._M_impl.super__Vector_impl_data._M_start + lVar1) + 0x10
                        ))((long)&(in_RDI->
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                  _M_impl.super__Vector_impl_data._M_start + lVar1);
    if (iVar3 == 0) {
      puVar2 = (in_RDI->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      (**(code **)(*(long *)puVar2 + 0x18))(puVar2,in_ESI,in_EDX);
    }
    else {
      OnlineMDPPlanner::GetLastActionChosen
                ((OnlineMDPPlanner *)
                 (in_RDI->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_finish);
    }
    AgentDecPOMDPDiscrete::GetPU
              ((AgentDecPOMDPDiscrete *)
               ((long)&(in_RDI->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                       _M_impl.super__Vector_impl_data._M_start +
               *(long *)((in_RDI->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                         _M_impl.super__Vector_impl_data._M_start + -6)));
    PlanningUnitMADPDiscrete::JointToIndividualActionIndices
              ((PlanningUnitMADPDiscrete *)
               CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
               (Index)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
    (in_RDI->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)((long)(in_RDI->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
    lVar1 = *(long *)((in_RDI->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                      _M_impl.super__Vector_impl_data._M_start + -6);
    uVar4 = (**(code **)(*(long *)((long)&(in_RDI->
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          )._M_impl.super__Vector_impl_data._M_start + lVar1) + 0x10
                        ))((long)&(in_RDI->
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                  _M_impl.super__Vector_impl_data._M_start + lVar1);
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        &stack0xffffffffffffffc8,(ulong)uVar4);
    IVar7 = *pvVar5;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(in_RDI);
    return IVar7;
  }
  uVar6 = __cxa_allocate_exception(0x28);
  E::E(in_stack_ffffffffffffffd0,(char *)in_stack_ffffffffffffffc8);
  __cxa_throw(uVar6,&E::typeinfo,E::~E);
}

Assistant:

Index AgentOnlinePlanningMDP::Act(Index sI, Index joI, double reward)
{
    if(_m_planner) // only plan if online MDP planner is available
                   // Pure learners will have this set to NULL
    {
        Index jaInew;
        if(GetIndex()==0) // we only need to search for one agent, to
                          // avoid duplicate work
            jaInew=_m_planner->SearchForAction(sI, joI);
        else
            jaInew=_m_planner->GetLastActionChosen();

#if DEBUG_AgentOnlinePlanningMDP
    cout << GetIndex() << ": s " << sI
         << " ja " << jaInew << endl;
#endif

        vector<Index> aIs=GetPU()->JointToIndividualActionIndices(jaInew);

        _m_t++;

        return(aIs[GetIndex()]);
    }

    // else may still be a learner, leave Act implementation to subclass
    throw(E("AgentOnlinePlanningMDP::Act error, no planning module available"));
    return INT_MAX;
}